

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O3

int __thiscall ON_wString::ReverseFind(ON_wString *this,wchar_t *s)

{
  wchar_t *pwVar1;
  int iVar2;
  wchar_t wVar3;
  wchar_t *pwVar4;
  bool bVar5;
  ON_Internal_Empty_wString *pOVar6;
  int element_count1;
  ulong uVar7;
  wchar_t *p0;
  
  uVar7 = 0;
  if (s != (wchar_t *)0x0) {
    do {
      if (s[uVar7] == L'\0') goto LAB_00673907;
      uVar7 = uVar7 + 1;
    } while (uVar7 != 0x7ffffffd);
    uVar7 = 0x7ffffffd;
  }
LAB_00673907:
  pwVar4 = this->m_s;
  pOVar6 = &empty_wstring;
  if (pwVar4 != (wchar_t *)0x0) {
    pOVar6 = (ON_Internal_Empty_wString *)(pwVar4 + -3);
  }
  element_count1 = (int)uVar7;
  if (0 < element_count1) {
    iVar2 = (pOVar6->header).string_length;
    if ((element_count1 <= iVar2) && (pwVar4 < pwVar4 + (long)(iVar2 - element_count1) + 1)) {
      wVar3 = *s;
      uVar7 = (long)iVar2 * 4 + (uVar7 & 0xffffffff) * -4;
      do {
        if ((wVar3 == *(wchar_t *)((long)pwVar4 + uVar7)) &&
           (bVar5 = EqualOrdinal((wchar_t *)((long)pwVar4 + uVar7),element_count1,s,element_count1,
                                 false), bVar5)) {
          return (int)(uVar7 >> 2);
        }
        pwVar1 = (wchar_t *)(uVar7 + (long)pwVar4);
        uVar7 = uVar7 - 4;
      } while (pwVar4 < pwVar1);
    }
  }
  return -1;
}

Assistant:

int ON_wString::ReverseFind(const wchar_t* s) const
{
  const int s_len = ON_wString::Length(s);
  const int this_len = Length();
  if (s_len > 0 && s_len <= this_len )
  {
    const wchar_t* p0 = m_s;
    const wchar_t* p = p0 + (this_len - s_len + 1);
    const wchar_t w0 = s[0];
    while (p > p0)
    {
      p--;
      if ( w0 == p[0] && ON_wString::EqualOrdinal(p,s_len,s,s_len,false) )
        return ((int)(p - p0));
    }
  }
  return -1;
}